

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

int PAL_vswprintf(char16_t *buffer,char16_t *format,__va_list_tag *argptr)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = PAL__wvsnprintf(buffer,0x7fffffff,format,argptr);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

__attribute__((no_instrument_function))
int
__cdecl
PAL_vswprintf(char16_t *buffer,
              const char16_t *format,
              va_list argptr)
{
    LONG Length;

    PERF_ENTRY(vswprintf);
    ENTRY("PAL_vswprintf (buffer=%p, format=%p (%S), argptr=%p)\n",
          buffer, format, format, argptr);

    Length = PAL__wvsnprintf(buffer, 0x7fffffff, format, argptr);

    LOGEXIT("PAL_vswprintf returns int %d\n", Length);
    PERF_EXIT(vswprintf);

    return Length;
}